

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

void __thiscall MeCab::anon_unknown_0::TaggerImpl::~TaggerImpl(TaggerImpl *this)

{
  (this->super_Tagger)._vptr_Tagger = (_func_int **)&PTR_parse_00139570;
  std::__cxx11::string::~string((string *)&this->what_);
  scoped_ptr<MeCab::Lattice>::~scoped_ptr(&this->lattice_);
  scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::~scoped_ptr(&this->model_);
  return;
}

Assistant:

TaggerImpl::~TaggerImpl() {}